

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

void Bmc_FxAddClauses(sat_solver *pSat,Vec_Int_t *vDivs,int iCiVarBeg,int iVarStart)

{
  sat_solver *psVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 in_register_00000014;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  sat_solver *local_68;
  ulong local_60;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  Vec_Int_t *local_38;
  
  local_80 = CONCAT44(in_register_00000014,iCiVarBeg);
  local_38 = vDivs;
  if ((vDivs->nSize & 3U) != 0) {
    __assert_fail("Vec_IntSize(vDivs) % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                  ,0x28a,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
  }
  iVar2 = vDivs->nSize >> 2;
  uVar9 = 0;
  local_54 = 0;
  if (0 < iVar2) {
    local_54 = iVar2;
  }
  local_54 = local_54 << 2;
  uVar10 = iVar2 + iVarStart;
  local_88 = (iVar2 + iVarStart) * 2;
  local_8c = (iVar2 + iVarStart) * 2 - 1;
  local_68 = pSat;
  do {
    p = local_38;
    local_88 = local_88 - 2;
    uVar10 = uVar10 - 1;
    iVar2 = (int)uVar9;
    if (local_54 == iVar2) {
      return;
    }
    iVar3 = Vec_IntEntry(local_38,iVar2);
    iVar4 = Vec_IntEntry(p,iVar2 + 1);
    iVar5 = Vec_IntEntry(p,iVar2 + 2);
    iVar2 = Vec_IntEntry(p,iVar2 + 3);
    local_84 = uVar10;
    local_60 = uVar9;
    if (iVar3 == 3) {
      iVar3 = Abc_Lit2Var(iVar4);
      local_78 = CONCAT44(local_78._4_4_,iVar5);
      iVar7 = (int)local_80;
      iVar5 = Abc_Lit2Var(iVar5);
      local_48 = CONCAT44(extraout_var,iVar5);
      local_70 = (ulong)(uint)(iVar5 + iVar7);
      iVar5 = Abc_Lit2Var(iVar2);
      local_50 = CONCAT44(extraout_var_00,iVar5);
      uVar8 = iVar7 + iVar5;
      iVar4 = Abc_LitIsCompl(iVar4);
      iVar5 = Abc_LitIsCompl((int)local_78);
      iVar2 = Abc_LitIsCompl(iVar2);
      psVar1 = local_68;
      local_40 = CONCAT44(extraout_var_01,iVar2);
      local_78 = (ulong)uVar8;
      if ((int)(iVar3 + iVar7 | uVar10 | (uint)local_70 | uVar8) < 0) {
        __assert_fail("iVarC >= 0 && iVarT >= 0 && iVarE >= 0 && iVarZ >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x19c,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      uVar10 = iVar4 + (iVar3 + iVar7) * 2;
      uVar8 = iVar5 + (uint)local_70 * 2;
      local_90 = local_88;
      local_98 = uVar10 ^ 1;
      local_94 = uVar8 ^ 1;
      iVar2 = sat_solver_addclause(local_68,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x1a2,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      local_90 = local_8c;
      local_98 = uVar10 ^ 1;
      local_94 = uVar8;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x1a8,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      uVar6 = (int)local_40 + (int)local_78 * 2;
      local_90 = local_88;
      local_98 = uVar10;
      local_94 = uVar6 ^ 1;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x1ae,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      local_90 = local_8c;
      local_98 = uVar10;
      local_94 = uVar6;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      uVar10 = local_84;
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x1b4,
                      "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                     );
      }
      if ((int)local_48 != (int)local_50) {
        local_90 = local_8c;
        local_98 = uVar8;
        local_94 = uVar6;
        iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
        if (iVar2 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1bd,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        local_90 = local_88;
        local_98 = uVar8 ^ 1;
        local_94 = uVar6 ^ 1;
        iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
        if (iVar2 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1c3,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      iVar2 = (int)local_60;
    }
    else if (iVar3 == 2) {
      iVar2 = Abc_Lit2Var(iVar4);
      iVar3 = (int)local_80;
      uVar11 = iVar2 + iVar3;
      iVar2 = Abc_Lit2Var(iVar5);
      psVar1 = local_68;
      uVar8 = local_8c;
      uVar6 = iVar2 + iVar3;
      if ((int)(uVar11 | uVar10 | uVar6) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x17d,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98 = local_8c;
      iVar2 = uVar11 * 2 + 1;
      local_90 = uVar6 * 2 + 1;
      local_70 = CONCAT44(local_70._4_4_,local_90);
      local_94 = iVar2;
      iVar3 = sat_solver_addclause(local_68,(lit *)&local_98,(lit *)&local_8c);
      if (iVar3 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x183,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98 = uVar8;
      local_94 = uVar11 * 2;
      local_90 = uVar6 * 2;
      iVar3 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      uVar10 = local_88;
      if (iVar3 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x189,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98 = local_88;
      local_94 = iVar2;
      local_90 = uVar6 * 2;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,399,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98 = uVar10;
      local_90 = (uint)local_70;
      local_94 = uVar11 * 2;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x195,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar2 = (int)local_60;
      local_88 = uVar10;
      uVar10 = local_84;
    }
    else {
      if (iVar3 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                      ,0x29e,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
      }
      iVar2 = Abc_Lit2Var(iVar4);
      iVar2 = iVar2 + (int)local_80;
      iVar3 = Abc_Lit2Var(iVar5);
      iVar4 = Abc_LitIsCompl(iVar4);
      iVar5 = Abc_LitIsCompl(iVar5);
      psVar1 = local_68;
      uVar8 = local_8c;
      local_98 = local_8c;
      uVar10 = iVar4 + iVar2 * 2;
      local_94 = uVar10;
      iVar2 = sat_solver_addclause(local_68,(lit *)&local_98,(lit *)&local_90);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x16b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
      local_98 = uVar8;
      uVar6 = iVar5 + (iVar3 + (int)local_80) * 2;
      local_94 = uVar6;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_90);
      uVar11 = local_88;
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x170,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
      local_98 = local_88;
      local_94 = uVar10 ^ 1;
      local_90 = uVar6 ^ 1;
      iVar2 = sat_solver_addclause(psVar1,(lit *)&local_98,(lit *)&local_8c);
      if (iVar2 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                      ,0x176,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)");
      }
      iVar2 = (int)local_60;
      local_8c = uVar8;
      local_88 = uVar11;
      uVar10 = local_84;
    }
    uVar9 = (ulong)(iVar2 + 4);
    local_8c = local_8c - 2;
  } while( true );
}

Assistant:

void Bmc_FxAddClauses( sat_solver * pSat, Vec_Int_t * vDivs, int iCiVarBeg, int iVarStart )
{
    int i, Func, pLits[3], nDivs = Vec_IntSize(vDivs)/4;
    assert( Vec_IntSize(vDivs) % 4 == 0 );
    // create new var for each divisor
    for ( i = 0; i < nDivs; i++ )
    {
        Func     = Vec_IntEntry(vDivs, 4*i+0);
        pLits[0] = Vec_IntEntry(vDivs, 4*i+1);
        pLits[1] = Vec_IntEntry(vDivs, 4*i+2);
        pLits[2] = Vec_IntEntry(vDivs, 4*i+3);
        //printf( "Adding clause with vars %d %d -> %d\n", iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iVarStart + nDivs - 1 - i );
        if ( Func == DIV_AND )
            sat_solver_add_and( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), 0 );
        else if ( Func == DIV_XOR )
            sat_solver_add_xor( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 0 );
        else if ( Func == DIV_MUX )
            sat_solver_add_mux( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iCiVarBeg + Abc_Lit2Var(pLits[2]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), Abc_LitIsCompl(pLits[2]), 0 );
        else assert( 0 );
    }
}